

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

zip_t * zip_open(char *zipname,int level,char mode)

{
  mz_bool mVar1;
  size_t sVar2;
  zip_t *local_28;
  zip_t *zip;
  char mode_local;
  int level_local;
  char *zipname_local;
  
  local_28 = (zip_t *)0x0;
  if ((zipname != (char *)0x0) && (sVar2 = strlen(zipname), sVar2 != 0)) {
    zip._4_4_ = level;
    if (level < 0) {
      zip._4_4_ = 6;
    }
    if (((zip._4_4_ & 0xf) < 0xb) &&
       (local_28 = (zip_t *)calloc(1,0x4e068), local_28 != (zip_t *)0x0)) {
      local_28->level = zip._4_4_;
      if ((mode == 'a') || (mode == 'r')) {
        mVar1 = mz_zip_reader_init_file((mz_zip_archive *)local_28,zipname,local_28->level | 0x800);
        if (mVar1 != 0) {
          if (mode != 'a') {
            return local_28;
          }
          mVar1 = mz_zip_writer_init_from_reader((mz_zip_archive *)local_28,zipname);
          if (mVar1 != 0) {
            return local_28;
          }
          mz_zip_reader_end((mz_zip_archive *)local_28);
        }
      }
      else if ((mode == 'w') &&
              (mVar1 = mz_zip_writer_init_file((mz_zip_archive *)local_28,zipname,0), mVar1 != 0)) {
        return local_28;
      }
    }
  }
  if (local_28 != (zip_t *)0x0) {
    free(local_28);
  }
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_open(const char *zipname, int level, char mode) {
  struct zip_t *zip = NULL;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    goto cleanup;
  }

  if (level < 0)
    level = MZ_DEFAULT_LEVEL;
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    goto cleanup;
  }

  zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip)
    goto cleanup;

  zip->level = (mz_uint)level;
  switch (mode) {
  case 'w':
    // Create a new archive.
    if (!mz_zip_writer_init_file(&(zip->archive), zipname, 0)) {
      // Cannot initialize zip_archive writer
      goto cleanup;
    }
    break;

  case 'r':
  case 'a':
    if (!mz_zip_reader_init_file(
            &(zip->archive), zipname,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      goto cleanup;
    }
    if (mode == 'a' &&
        !mz_zip_writer_init_from_reader(&(zip->archive), zipname)) {
      mz_zip_reader_end(&(zip->archive));
      goto cleanup;
    }
    break;

  default:
    goto cleanup;
  }

  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}